

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RichHdrWrapper.cpp
# Opt level: O3

RICH_COMP_ID __thiscall RichHdrWrapper::getCompId(RichHdrWrapper *this,size_t fieldId)

{
  DWORD DVar1;
  size_t sVar2;
  int iVar3;
  undefined4 extraout_var;
  RICH_COMP_ID RVar4;
  bool isOk;
  undefined8 uStack_28;
  
  RVar4.CV = 0;
  RVar4.prodId = 0;
  RVar4.count = 0;
  if ((this->richSign != (RICH_SIGNATURE *)0x0) && (this->dansHdr != (RICH_DANS_HEADER *)0x0)) {
    DVar1 = this->richSign->checksum;
    sVar2 = this->compIdCounter;
    uStack_28 = 0;
    iVar3 = (*(this->super_PEElementWrapper).super_ExeElementWrapper.super_AbstractByteBuffer.
              _vptr_AbstractByteBuffer[0x1c])(this,fieldId,0xffffffffffffffff,(long)&uStack_28 + 7);
    if (uStack_28._7_1_ == '\x01') {
      RVar4.CV = 0;
      RVar4.prodId = 0;
      RVar4.count = 0;
      if ((3 < fieldId) && (fieldId <= sVar2 + 3)) {
        RVar4 = (RICH_COMP_ID)(CONCAT44(extraout_var,iVar3) ^ CONCAT44(DVar1,DVar1));
      }
    }
    else {
      RVar4.CV = 0;
      RVar4.prodId = 0;
      RVar4.count = 0;
    }
  }
  return RVar4;
}

Assistant:

pe::RICH_COMP_ID RichHdrWrapper::getCompId(size_t fieldId)
{
    pe::RICH_COMP_ID emptyId = { 0 };
    if (!this->richSign || !this->dansHdr) {
        return emptyId;
    }
    const uint32_t xorVal = this->richSign->checksum;
    const size_t cnt = this->compIdCounter - 1;
    bool isOk = false;
    uint64_t num = this->getNumValue(fieldId, &isOk);
    if (!isOk) {
        return emptyId;
    }
    if (fieldId >= COMP_ID_1 && fieldId <= COMP_ID_1 + cnt)
    {
        uint64_t xorVal2 = xorVal | ((uint64_t)xorVal << sizeof(uint32_t)*8);
        uint64_t my_num = static_cast<uint64_t>(num) ^ (xorVal2);
        pe::RICH_COMP_ID* myCompId = reinterpret_cast<pe::RICH_COMP_ID*>(&my_num);
        return *myCompId;
    }
    return emptyId;
}